

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int cpio_getopt(cpio *cpio)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long *in_RDI;
  int required;
  int opt;
  size_t optlength;
  char *long_prefix;
  char *p;
  option *match2;
  option *match;
  option *popt;
  uint local_44;
  size_t local_40;
  char *local_38;
  option *local_28;
  option *local_20;
  cpio *in_stack_ffffffffffffffe8;
  option *poVar5;
  option *poVar6;
  uint local_4;
  
  local_20 = (option *)0x0;
  local_28 = (option *)0x0;
  local_38 = "--";
  local_44 = 0x3f;
  *in_RDI = 0;
  if (cpio_getopt::state == 0) {
    in_RDI[0x18] = in_RDI[0x18] + 8;
    *(int *)(in_RDI + 0x17) = (int)in_RDI[0x17] + -1;
    cpio_getopt::state = 1;
  }
  if (cpio_getopt::state == 1) {
    if (*(long *)in_RDI[0x18] == 0) {
      return -1;
    }
    if (**(char **)in_RDI[0x18] != '-') {
      return -1;
    }
    iVar2 = strcmp(*(char **)in_RDI[0x18],"--");
    if (iVar2 == 0) {
      in_RDI[0x18] = in_RDI[0x18] + 8;
      *(int *)(in_RDI + 0x17) = (int)in_RDI[0x17] + -1;
      return -1;
    }
    puVar1 = (undefined8 *)in_RDI[0x18];
    in_RDI[0x18] = (long)(puVar1 + 1);
    cpio_getopt::opt_word = (char *)*puVar1;
    *(int *)(in_RDI + 0x17) = (int)in_RDI[0x17] + -1;
    if (cpio_getopt::opt_word[1] == '-') {
      cpio_getopt::state = 3;
      cpio_getopt::opt_word = cpio_getopt::opt_word + 2;
    }
    else {
      cpio_getopt::state = 2;
      cpio_getopt::opt_word = cpio_getopt::opt_word + 1;
    }
  }
  if (cpio_getopt::state == 2) {
    local_44 = (uint)*cpio_getopt::opt_word;
    if (local_44 == 0) {
      cpio_getopt::state = 1;
      cpio_getopt::opt_word = cpio_getopt::opt_word + 1;
      iVar2 = cpio_getopt(in_stack_ffffffffffffffe8);
      return iVar2;
    }
    cpio_getopt::opt_word = cpio_getopt::opt_word + 1;
    pcVar3 = strchr(short_options,local_44);
    if (pcVar3 == (char *)0x0) {
      return 0x3f;
    }
    if (pcVar3[1] == ':') {
      if (*cpio_getopt::opt_word == '\0') {
        cpio_getopt::opt_word = *(char **)in_RDI[0x18];
        if (cpio_getopt::opt_word == (char *)0x0) {
          lafe_warnc(0,"Option -%c requires an argument",(ulong)local_44);
          return 0x3f;
        }
        in_RDI[0x18] = in_RDI[0x18] + 8;
        *(int *)(in_RDI + 0x17) = (int)in_RDI[0x17] + -1;
      }
      if (local_44 == 0x57) {
        cpio_getopt::state = 3;
        local_38 = "-W ";
      }
      else {
        cpio_getopt::state = 1;
        *in_RDI = (long)cpio_getopt::opt_word;
      }
    }
  }
  if (cpio_getopt::state == 3) {
    cpio_getopt::state = 1;
    pcVar3 = strchr(cpio_getopt::opt_word,0x3d);
    if (pcVar3 == (char *)0x0) {
      local_40 = strlen(cpio_getopt::opt_word);
    }
    else {
      local_40 = (long)pcVar3 - (long)cpio_getopt::opt_word;
      *in_RDI = (long)(pcVar3 + 1);
    }
    poVar5 = cpio_longopts;
    while (poVar5->name != (char *)0x0) {
      poVar6 = poVar5;
      if ((*poVar5->name == *cpio_getopt::opt_word) &&
         (iVar2 = strncmp(cpio_getopt::opt_word,poVar5->name,local_40), poVar6 = poVar5, iVar2 == 0)
         ) {
        local_28 = local_20;
        sVar4 = strlen(poVar5->name);
        local_20 = poVar5;
        if (sVar4 == local_40) {
          local_28 = (option *)0x0;
          break;
        }
      }
      poVar5 = poVar6 + 1;
    }
    if (local_20 == (option *)0x0) {
      lafe_warnc(0,"Option %s%s is not supported",local_38,cpio_getopt::opt_word);
      local_4 = 0x3f;
    }
    else if (local_28 == (option *)0x0) {
      if (local_20->required == 0) {
        if (*in_RDI != 0) {
          lafe_warnc(0,"Option %s%s does not allow an argument",local_38,local_20->name);
          return 0x3f;
        }
      }
      else if (*in_RDI == 0) {
        *in_RDI = *(long *)in_RDI[0x18];
        if (*in_RDI == 0) {
          lafe_warnc(0,"Option %s%s requires an argument",local_38,local_20->name);
          return 0x3f;
        }
        in_RDI[0x18] = in_RDI[0x18] + 8;
        *(int *)(in_RDI + 0x17) = (int)in_RDI[0x17] + -1;
      }
      local_4 = local_20->equivalent;
    }
    else {
      lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",local_38,cpio_getopt::opt_word,
                 local_20->name,local_28->name);
      local_4 = 0x3f;
    }
  }
  else {
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

int
cpio_getopt(struct cpio *cpio)
{
	enum { state_start = 0, state_next_word, state_short, state_long };
	static int state = state_start;
	static char *opt_word;

	const struct option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	cpio->argument = NULL;

	/* First time through, initialize everything. */
	if (state == state_start) {
		/* Skip program name. */
		++cpio->argv;
		--cpio->argc;
		state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (state == state_next_word) {
		/* No more arguments, so no more options. */
		if (cpio->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (cpio->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(cpio->argv[0], "--") == 0) {
			++cpio->argv;
			--cpio->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		opt_word = *cpio->argv++;
		--cpio->argc;
		if (opt_word[1] == '-') {
			/* Set up long option parser. */
			state = state_long;
			opt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			state = state_short;
			++opt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *opt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			state = state_next_word;
			return cpio_getopt(cpio);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, opt_word already points to it. */
			if (opt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				opt_word = *cpio->argv;
				if (opt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
			if (opt == 'W') {
				state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				state = state_next_word;
				cpio->argument = opt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (state == state_long) {
		/* After this long option, we'll be starting a new word. */
		state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(opt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - opt_word);
			cpio->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(opt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = cpio_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != opt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(opt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, opt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, opt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (cpio->argument == NULL) {
				cpio->argument = *cpio->argv;
				if (cpio->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++cpio->argv;
				--cpio->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (cpio->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}